

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

int newlabelentry(LexState *ls,Labellist *l,TString *name,int line,int pc)

{
  int nelems;
  Labeldesc *pLVar1;
  int n;
  int pc_local;
  int line_local;
  TString *name_local;
  Labellist *l_local;
  LexState *ls_local;
  
  nelems = l->n;
  pLVar1 = (Labeldesc *)luaM_growaux_(ls->L,l->arr,nelems,&l->size,0x18,0x7fff,"labels/gotos");
  l->arr = pLVar1;
  l->arr[nelems].name = name;
  l->arr[nelems].line = line;
  l->arr[nelems].nactvar = ls->fs->nactvar;
  l->arr[nelems].close = '\0';
  l->arr[nelems].pc = pc;
  l->n = nelems + 1;
  return nelems;
}

Assistant:

static int newlabelentry (LexState *ls, Labellist *l, TString *name,
                          int line, int pc) {
  int n = l->n;
  luaM_growvector(ls->L, l->arr, n, l->size,
                  Labeldesc, SHRT_MAX, "labels/gotos");
  l->arr[n].name = name;
  l->arr[n].line = line;
  l->arr[n].nactvar = ls->fs->nactvar;
  l->arr[n].close = 0;
  l->arr[n].pc = pc;
  l->n = n + 1;
  return n;
}